

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

int __thiscall flow::BasicBlock::remove(BasicBlock *this,char *__filename)

{
  bool bVar1;
  TerminateInstr *pTVar2;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *this_00;
  reference ppVVar3;
  reference puVar4;
  TerminateInstr *in_RDX;
  BasicBlock *local_c8;
  const_iterator local_80;
  undefined1 local_71;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_70;
  Instr **local_68;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *local_60;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_58;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  local_50;
  __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  i;
  BasicBlock *bb;
  Value *operand;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *__range2;
  Instr *instr_local;
  BasicBlock *this_local;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *removedInstr;
  
  __range2 = (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)in_RDX;
  instr_local = (Instr *)__filename;
  this_local = this;
  pTVar2 = getTerminator((BasicBlock *)__filename);
  if (in_RDX == pTVar2) {
    this_00 = Instr::operands((Instr *)__range2);
    __end2 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::begin(this_00);
    operand = (Value *)std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<flow::Value_*const_*,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
                                       *)&operand), bVar1) {
      ppVVar3 = __gnu_cxx::
                __normal_iterator<flow::Value_*const_*,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
                ::operator*(&__end2);
      if (*ppVVar3 == (Value *)0x0) {
        local_c8 = (BasicBlock *)0x0;
      }
      else {
        local_c8 = (BasicBlock *)__dynamic_cast(*ppVVar3,&Value::typeinfo,&typeinfo,0);
      }
      i._M_current = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_c8;
      if (local_c8 != (BasicBlock *)0x0) {
        unlinkSuccessor((BasicBlock *)__filename,local_c8);
      }
      __gnu_cxx::
      __normal_iterator<flow::Value_*const_*,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
      ::operator++(&__end2);
    }
  }
  local_58._M_current =
       (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
       std::
       vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
       ::begin((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                *)(__filename + 0x50));
  local_60 = (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
             std::
             vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ::end((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                    *)(__filename + 0x50));
  local_68 = (Instr **)&__range2;
  local_50 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>*,std::vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>>,flow::BasicBlock::remove(flow::Instr*)::__0>
                       (local_58,(__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                                  )local_60,(anon_class_8_1_a815520c_for__M_pred)local_68);
  local_70._M_current =
       (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)
       std::
       vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
       ::end((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
              *)(__filename + 0x50));
  bVar1 = __gnu_cxx::operator!=(&local_50,&local_70);
  if (!bVar1) {
    __assert_fail("i != code_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0x4c,"std::unique_ptr<Instr> flow::BasicBlock::remove(Instr *)");
  }
  local_71 = 0;
  puVar4 = __gnu_cxx::
           __normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
           ::operator*(&local_50);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::unique_ptr
            ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)this,puVar4);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>const*,std::vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>>
  ::__normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>*>
            ((__normal_iterator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>const*,std::vector<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>,std::allocator<std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>>>>
              *)&local_80,&local_50);
  std::
  vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  ::erase((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
           *)(__filename + 0x50),local_80);
  Instr::setParent((Instr *)__range2,(BasicBlock *)0x0);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> BasicBlock::remove(Instr* instr) {
  // if we're removing the terminator instruction
  if (instr == getTerminator()) {
    // then unlink all successors also
    for (Value* operand : instr->operands()) {
      if (auto bb = dynamic_cast<BasicBlock*>(operand)) {
        unlinkSuccessor(bb);
      }
    }
  }

  auto i = std::find_if(
      code_.begin(), code_.end(),
      [&](const auto& obj) { return obj.get() == instr; });
  assert(i != code_.end());

  std::unique_ptr<Instr> removedInstr = std::move(*i);
  code_.erase(i);
  instr->setParent(nullptr);
  return removedInstr;
}